

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

void IoTHubTransport_MQTT_Common_Destroy(TRANSPORT_LL_HANDLE handle)

{
  DLIST_ENTRY_TAG *pDVar1;
  int iVar2;
  PDLIST_ENTRY pDVar3;
  PDLIST_ENTRY pDVar4;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  DLIST_ENTRY messageCompleted;
  DLIST_ENTRY_TAG DStack_38;
  
  if (handle != (TRANSPORT_LL_HANDLE)0x0) {
    *(undefined1 *)((long)handle + 0x8c) = 1;
    DisconnectFromClient((PMQTTTRANSPORT_HANDLE_DATA)handle);
    pDVar4 = (PDLIST_ENTRY)((long)handle + 0xf8);
    iVar2 = DList_IsListEmpty(pDVar4);
    while (iVar2 == 0) {
      pDVar3 = DList_RemoveHeadList(pDVar4);
      pDVar1 = pDVar3[-2].Blink;
      DList_InitializeListHead(&DStack_38);
      DList_InsertTailList(&DStack_38,(PDLIST_ENTRY)&pDVar1[1].Blink);
      (**(code **)((long)handle + 0x138))(&DStack_38,1,*(undefined8 *)((long)handle + 0x168));
      free(&pDVar3[-3].Blink);
      iVar2 = DList_IsListEmpty(pDVar4);
    }
    while (iVar2 = DList_IsListEmpty((PDLIST_ENTRY)((long)handle + 0xd0)), iVar2 == 0) {
      pDVar4 = DList_RemoveHeadList((PDLIST_ENTRY)((long)handle + 0xd0));
      if (pDVar4[1].Flink == (DLIST_ENTRY_TAG *)0x0) {
        (**(code **)((long)handle + 0x148))
                  (*(undefined4 *)((long)&pDVar4[-2].Blink + 4),0x198,
                   *(undefined8 *)((long)handle + 0x168));
      }
      else {
        (*(code *)pDVar4[1].Flink)(0,0,0,pDVar4[1].Blink);
      }
      free(pDVar4 + -3);
    }
    while (iVar2 = DList_IsListEmpty((PDLIST_ENTRY)((long)handle + 0xe0)), iVar2 == 0) {
      pDVar4 = DList_RemoveHeadList((PDLIST_ENTRY)((long)handle + 0xe0));
      (*(code *)pDVar4[1].Flink)(0,0,0,pDVar4[1].Blink);
      free(pDVar4 + -3);
    }
    freeTransportHandleData((MQTTTRANSPORT_HANDLE_DATA *)handle);
  }
  return;
}

Assistant:

void IoTHubTransport_MQTT_Common_Destroy(TRANSPORT_LL_HANDLE handle)
{
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data != NULL)
    {
        transport_data->isDestroyCalled = true;

        DisconnectFromClient(transport_data);

        //Empty the Waiting for Ack Messages.
        while (!DList_IsListEmpty(&transport_data->telemetry_waitingForAck))
        {
            PDLIST_ENTRY currentEntry = DList_RemoveHeadList(&transport_data->telemetry_waitingForAck);
            MQTT_MESSAGE_DETAILS_LIST* mqttMsgEntry = containingRecord(currentEntry, MQTT_MESSAGE_DETAILS_LIST, entry);
            notifyApplicationOfSendMessageComplete(mqttMsgEntry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_BECAUSE_DESTROY);
            free(mqttMsgEntry);
        }
        while (!DList_IsListEmpty(&transport_data->ack_waiting_queue))
        {
            PDLIST_ENTRY currentEntry = DList_RemoveHeadList(&transport_data->ack_waiting_queue);
            MQTT_DEVICE_TWIN_ITEM* mqtt_device_twin = containingRecord(currentEntry, MQTT_DEVICE_TWIN_ITEM, entry);

            if (mqtt_device_twin->userCallback == NULL)
            {
                transport_data->transport_callbacks.twin_rpt_state_complete_cb(mqtt_device_twin->iothub_msg_id, STATUS_CODE_TIMEOUT_VALUE, transport_data->transport_ctx);
            }
            else
            {
                mqtt_device_twin->userCallback(DEVICE_TWIN_UPDATE_COMPLETE, NULL, 0, mqtt_device_twin->userContext);
            }

            destroyDeviceTwinGetMsg(mqtt_device_twin);
        }
        while (!DList_IsListEmpty(&transport_data->pending_get_twin_queue))
        {
            PDLIST_ENTRY currentEntry = DList_RemoveHeadList(&transport_data->pending_get_twin_queue);

            MQTT_DEVICE_TWIN_ITEM* mqtt_device_twin = containingRecord(currentEntry, MQTT_DEVICE_TWIN_ITEM, entry);

            mqtt_device_twin->userCallback(DEVICE_TWIN_UPDATE_COMPLETE, NULL, 0, mqtt_device_twin->userContext);

            destroyDeviceTwinGetMsg(mqtt_device_twin);
        }

        freeTransportHandleData(transport_data);
    }
}